

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probabilities.cpp
# Opt level: O1

double __thiscall probabilities::probabilityPoisson(probabilities *this,int k,double deltaT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (k < 1) {
    dVar2 = 1.0;
    dVar3 = 1.0;
  }
  else {
    dVar1 = 1.0;
    dVar3 = 1.0;
    dVar2 = 1.0;
    do {
      dVar3 = dVar3 * (this->super_Process).lambda * deltaT;
      dVar2 = dVar2 * dVar1;
      dVar1 = dVar1 + 1.0;
      k = k + -1;
    } while (k != 0);
  }
  dVar1 = exp(-(this->super_Process).lambda * deltaT);
  return (dVar1 * dVar3) / dVar2;
}

Assistant:

double probabilities::probabilityPoisson(int k, double deltaT) {
    double temp1 = 1.0, temp2 = 1.0, p;
    for (int i = 1; i <= k; i++){
        temp1 *= lambda*deltaT;
        temp2 *= i;
    }
    p = temp1*exp(-lambda*deltaT)/temp2;

    return p;
}